

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMDataBlock.cpp
# Opt level: O0

vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_> *
ZXing::DataMatrix::GetDataBlocks(ByteArray *rawCodewords,Version *version,bool fix259)

{
  value_type vVar1;
  ECBlocks *pEVar2;
  int iVar3;
  ECBlocks *pEVar4;
  const_reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  byte in_CL;
  long in_RDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_> *in_RDI;
  bool bVar8;
  int iOffset;
  int jOffset;
  int j_2;
  int i_2;
  int j_1;
  int numLongerBlocks;
  bool size144x144;
  int j;
  int i_1;
  int rawCodewordsOffset;
  int numDataCodewords;
  int numCodewords;
  int i;
  anon_struct_8_2_fb5c1508 *ecBlock;
  anon_struct_8_2_fb5c1508 *__end2;
  anon_struct_8_2_fb5c1508 *__begin2;
  anon_struct_8_2_fb5c1508 (*__range2) [2];
  vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_> result;
  int numResultBlocks;
  ECBlocks *ecBlocks;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  int local_108;
  int local_104;
  undefined4 in_stack_ffffffffffffff00;
  int iVar9;
  int iVar10;
  int in_stack_ffffffffffffff0c;
  vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_> *__n;
  vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_> *this;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_7c;
  anon_struct_8_2_fb5c1508 *local_68;
  vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_> local_48;
  int local_2c;
  ECBlocks *local_28;
  byte local_19;
  long local_18;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_10;
  
  local_19 = in_CL & 1;
  local_28 = (ECBlocks *)(in_RDX + 0x14);
  __n = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_2c = Version::ECBlocks::numBlocks(local_28);
  this = &local_48;
  std::vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>::vector
            ((vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_> *)
             0x26a741);
  std::vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>::reserve
            (this,(size_type)__n);
  pEVar4 = local_28 + 1;
  pEVar2 = local_28;
  while (local_68 = pEVar2->blocks, (ECBlocks *)local_68 != pEVar4) {
    for (local_7c = 0; local_7c < local_68->count; local_7c = local_7c + 1) {
      ByteArray::ByteArray((ByteArray *)in_RDI,in_stack_ffffffffffffff0c);
      std::vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>::
      push_back((vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                 *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                (value_type *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      DataBlock::~DataBlock((DataBlock *)0x26a828);
    }
    pEVar2 = (ECBlocks *)&local_68->dataCodewords;
  }
  std::vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>::
  operator[](&local_48,0);
  iVar3 = Size<ZXing::ByteArray>
                    ((ByteArray *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  local_c4 = iVar3 - local_28->codewordsPerBlock;
  local_ac = 0;
  for (local_b0 = 0; local_b0 < local_c4 + -1; local_b0 = local_b0 + 1) {
    for (local_b4 = 0; local_b4 < local_2c; local_b4 = local_b4 + 1) {
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (local_10,(long)local_ac);
      vVar1 = *pvVar5;
      pvVar6 = std::
               vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>::
               operator[](&local_48,(long)local_b4);
      pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&(pvVar6->codewords).
                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                          (long)local_b0);
      *pvVar7 = vVar1;
      local_ac = local_ac + 1;
    }
  }
  bVar8 = *(int *)(local_18 + 4) != 0x90;
  iVar9 = local_2c;
  if (!bVar8) {
    iVar9 = 8;
  }
  iVar10 = iVar9;
  for (local_c0 = 0; local_c0 < iVar9; local_c0 = local_c0 + 1) {
    pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (local_10,(long)local_ac);
    in_stack_ffffffffffffff00 = CONCAT13(*pvVar5,(int3)in_stack_ffffffffffffff00);
    pvVar6 = std::
             vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>::
             operator[](&local_48,(long)local_c0);
    pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&(pvVar6->codewords).
                         super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                        (long)(local_c4 + -1));
    *pvVar7 = (value_type)((uint)in_stack_ffffffffffffff00 >> 0x18);
    local_ac = local_ac + 1;
  }
  for (; local_c4 < iVar3; local_c4 = local_c4 + 1) {
    for (local_c8 = 0; local_c8 < local_2c; local_c8 = local_c8 + 1) {
      if ((bVar8) || ((local_19 & 1) == 0)) {
        local_104 = local_c8;
      }
      else {
        local_104 = (local_c8 + 8) % local_2c;
      }
      if ((bVar8) || (local_104 < 8)) {
        local_108 = local_c4;
      }
      else {
        local_108 = local_c4 + -1;
      }
      pvVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (local_10,(long)local_ac);
      in_stack_fffffffffffffef4 = CONCAT13(*pvVar5,(int3)in_stack_fffffffffffffef4);
      pvVar6 = std::
               vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>::
               operator[](&local_48,(long)local_104);
      pvVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&(pvVar6->codewords).
                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>,
                          (long)local_108);
      *pvVar7 = (value_type)((uint)in_stack_fffffffffffffef4 >> 0x18);
      local_ac = local_ac + 1;
    }
  }
  iVar3 = Size<ZXing::ByteArray>
                    ((ByteArray *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  if (local_ac == iVar3) {
    std::vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>::vector
              ((vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                *)CONCAT44(in_stack_fffffffffffffef4,iVar3),
               (vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                *)CONCAT44(local_ac,in_stack_fffffffffffffee8));
  }
  else {
    memset(in_RDI,0,0x18);
    std::vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>::vector
              ((vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>
                *)0x26ab5f);
  }
  std::vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_>::~vector
            ((vector<ZXing::DataMatrix::DataBlock,_std::allocator<ZXing::DataMatrix::DataBlock>_> *)
             CONCAT44(iVar10,in_stack_ffffffffffffff00));
  return __n;
}

Assistant:

std::vector<DataBlock> GetDataBlocks(const ByteArray& rawCodewords, const Version& version, bool fix259)
{
	// First count the total number of data blocks
	// Now establish DataBlocks of the appropriate size and number of data codewords
	auto& ecBlocks = version.ecBlocks;
	const int numResultBlocks = ecBlocks.numBlocks();
	std::vector<DataBlock> result;
	result.reserve(numResultBlocks);
	for (auto& ecBlock : ecBlocks.blocks)
		for (int i = 0; i < ecBlock.count; i++)
			result.push_back({ecBlock.dataCodewords, ByteArray(ecBlocks.codewordsPerBlock + ecBlock.dataCodewords)});

	// All blocks have the same amount of data, except that the last n
	// (where n may be 0) have 1 less byte. Figure out where these start.
	// TODO(bbrown): There is only one case where there is a difference for Data Matrix for size 144
	const int numCodewords = Size(result[0].codewords);
	const int numDataCodewords = numCodewords - ecBlocks.codewordsPerBlock;

	// The last elements of result may be 1 element shorter for 144 matrix
	// first fill out as many elements as all of them have minus 1
	int rawCodewordsOffset = 0;
	for (int i = 0; i < numDataCodewords - 1; i++)
		for (int j = 0; j < numResultBlocks; j++)
			result[j].codewords[i] = rawCodewords[rawCodewordsOffset++];

	// Fill out the last data block in the longer ones
	const bool size144x144 = version.symbolHeight == 144;
	const int numLongerBlocks = size144x144 ? 8 : numResultBlocks;
	for (int j = 0; j < numLongerBlocks; j++)
		result[j].codewords[numDataCodewords - 1] = rawCodewords[rawCodewordsOffset++];

	// Now add in error correction blocks
	for (int i = numDataCodewords; i < numCodewords; i++) {
		for (int j = 0; j < numResultBlocks; j++) {
			int jOffset = size144x144 && fix259 ? (j + 8) % numResultBlocks : j;
			int iOffset = size144x144 && jOffset > 7 ? i - 1 : i;
			result[jOffset].codewords[iOffset] = rawCodewords[rawCodewordsOffset++];
		}
	}

	if (rawCodewordsOffset != Size(rawCodewords))
		return {};

	return result;
}